

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTestCase.cpp
# Opt level: O2

void __thiscall
SuiteParserTests::readFixMessageFixture::readFixMessageFixture(readFixMessageFixture *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->fixMsg1)._M_dataplus._M_p = (pointer)&(this->fixMsg1).field_2;
  (this->fixMsg1)._M_string_length = 0;
  (this->fixMsg1).field_2._M_local_buf[0] = '\0';
  (this->fixMsg2)._M_dataplus._M_p = (pointer)&(this->fixMsg2).field_2;
  (this->fixMsg2)._M_string_length = 0;
  (this->fixMsg2).field_2._M_local_buf[0] = '\0';
  (this->fixMsg3)._M_dataplus._M_p = (pointer)&(this->fixMsg3).field_2;
  (this->fixMsg3)._M_string_length = 0;
  (this->fixMsg3).field_2._M_local_buf[0] = '\0';
  (this->badLength)._M_dataplus._M_p = (pointer)&(this->badLength).field_2;
  (this->badLength)._M_string_length = 0;
  (this->badLength).field_2._M_local_buf[0] = '\0';
  (this->object).m_buffer._M_dataplus._M_p = (pointer)&(this->object).m_buffer.field_2;
  (this->object).m_buffer._M_string_length = 0;
  (this->object).m_buffer.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)this);
  std::__cxx11::string::assign((char *)&this->fixMsg2);
  std::__cxx11::string::assign((char *)&this->fixMsg3);
  std::__cxx11::string::assign((char *)&this->badLength);
  std::operator+(&local_90,&this->fixMsg1,&this->fixMsg2);
  std::operator+(&local_70,&local_90,&this->fixMsg3);
  std::operator+(&local_50,&local_70,&this->badLength);
  std::__cxx11::string::append((string *)&this->object);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

readFixMessageFixture()
  {
    fixMsg1   = "8=FIX.4.2\0019=12\00135=A\001108=30\00110=31\001";
    fixMsg2   = "8=FIX.4.2\0019=17\00135=4\00136=88\001123=Y\00110=34\001";
    fixMsg3   = "8=FIX.4.2\0019=19\00135=A\001108=30\0019710=8\00110=31\001";

    badLength = "8=FIX.4.2\0019=200A\00135=A\001108=30\00110=31\001";


    object.addToStream( fixMsg1 + fixMsg2 + fixMsg3 + badLength );
  }